

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool __thiscall pbrt::Image::WritePNG(Image *this,string *name,ImageMetadata *metadata)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uchar uVar5;
  uchar *image;
  ulong uVar6;
  uint uVar7;
  int c;
  long lVar8;
  long lVar9;
  uint uVar10;
  Point2i p;
  ushort *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  float fVar13;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar15 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int nOutOfGamut;
  string ret;
  int local_9c;
  uchar *local_98;
  float local_8c;
  long local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  local_9c = 0;
  iVar2 = (int)(this->channelNames).nStored;
  if (this->format == U256) {
    if (iVar2 == 3) {
      uVar10 = lodepng_encode24_file
                         ((name->_M_dataplus)._M_p,(this->p8).ptr,
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    else {
      if (iVar2 != 1) {
        local_80._M_dataplus._M_p._0_4_ = iVar2;
        LogFatal<int>(Fatal,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                      ,0x530,"Unhandled channel count in WritePNG(): %d",(int *)&local_80);
      }
      uVar10 = lodepng_encode_file((name->_M_dataplus)._M_p,(this->p8).ptr,
                                   (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                                   (this->resolution).super_Tuple2<pbrt::Point2,_int>.y,LCT_GREY,8);
    }
  }
  else {
    if (iVar2 == 1) {
      uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar6 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * (long)(int)uVar10;
      image = (uchar *)operator_new__(uVar6);
      memset(image,0,uVar6);
      if (0 < (long)(int)uVar10) {
        lVar8 = 0;
        local_88 = 0;
        local_98 = image;
        local_60 = name;
        do {
          if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            uVar10 = (uint)local_88;
            lVar9 = 0;
            do {
              local_8c = (float)*(ushort *)
                                 (BlueNoiseTextures +
                                 (ulong)(uVar10 & 0x7f) * 2 + (ulong)(((uint)lVar9 & 0x7f) << 8)) /
                         65535.0 + -0.5;
              auVar19._0_4_ = GetChannel(this,(Point2i)(lVar8 + lVar9),0,(WrapMode2D)0x200000002);
              auVar19._4_60_ = extraout_var_01;
              auVar23 = ZEXT816(0) << 0x40;
              if ((auVar19._0_4_ < 0.0) || (1.0 < auVar19._0_4_)) {
                local_9c = local_9c + 1;
              }
              if (auVar19._0_4_ <= 0.0) {
                uVar5 = '\0';
              }
              else {
                uVar5 = 0xff;
                if (auVar19._0_4_ < 1.0) {
                  fVar13 = 12.92;
                  if (0.0031308 < auVar19._0_4_) {
                    auVar15 = vmaxss_avx(auVar19._0_16_,auVar23);
                    if (auVar15._0_4_ < 0.0) {
                      local_50 = CONCAT44(local_50._4_4_,auVar19._0_4_);
                      auVar20._0_4_ = sqrtf(auVar15._0_4_);
                      auVar20._4_60_ = extraout_var_02;
                      auVar15 = auVar20._0_16_;
                      auVar23 = ZEXT816(0) << 0x40;
                      auVar19._0_4_ = (Float)local_50;
                    }
                    else {
                      auVar15 = vsqrtss_avx(auVar15,auVar15);
                    }
                    auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbc84ba3b),0),auVar15,
                                              ZEXT416(0x3f4151ce));
                    auVar16._0_4_ = auVar15._0_4_;
                    auVar15 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar16._0_4_ + 1.8970238)),0x10)
                    ;
                    auVar16._4_4_ = auVar16._0_4_;
                    auVar16._8_4_ = auVar16._0_4_;
                    auVar16._12_4_ = auVar16._0_4_;
                    auVar15 = vfmadd213ps_fma(auVar15,auVar16,_DAT_0045a640);
                    auVar15 = vfmadd213ps_fma(auVar15,auVar16,_DAT_0045a650);
                    auVar15 = vfmadd213ps_fma(auVar15,auVar16,_DAT_0045a660);
                    auVar12 = vfmadd213ps_fma(auVar15,auVar16,_DAT_0045a670);
                    auVar15 = vmovshdup_avx(auVar12);
                    fVar13 = auVar12._0_4_ / auVar15._0_4_;
                  }
                  auVar15 = vfmadd213ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar13)),
                                            SUB6416(ZEXT464(0x437f0000),0),ZEXT416((uint)local_8c));
                  auVar22._8_4_ = 0x3effffff;
                  auVar22._0_8_ = 0x3effffff3effffff;
                  auVar22._12_4_ = 0x3effffff;
                  auVar12._8_4_ = 0x80000000;
                  auVar12._0_8_ = 0x8000000080000000;
                  auVar12._12_4_ = 0x80000000;
                  auVar12 = vpternlogd_avx512vl(auVar22,auVar15,auVar12,0xf8);
                  auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar12._0_4_));
                  auVar12 = vroundss_avx(auVar15,auVar15,0xb);
                  auVar15 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar12);
                  uVar3 = vcmpss_avx512f(auVar12,auVar23,1);
                  uVar5 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar15._0_4_);
                }
              }
              local_98[lVar9 + (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x *
                               (long)(int)uVar10] = uVar5;
              lVar9 = lVar9 + 1;
            } while (lVar9 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
          }
          local_88 = local_88 + 1;
          uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          lVar8 = lVar8 + 0x100000000;
          name = local_60;
          image = local_98;
        } while (local_88 < (int)uVar10);
      }
      uVar10 = lodepng_encode_file((name->_M_dataplus)._M_p,image,
                                   (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,uVar10,
                                   LCT_GREY,8);
    }
    else {
      uVar10 = 0;
      if (iVar2 != 3) goto LAB_00273255;
      uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar6 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * (long)(int)uVar10 * 3;
      local_60 = name;
      image = (uchar *)operator_new__(uVar6);
      uVar7 = 0;
      memset(image,0,uVar6);
      if (0 < (long)(int)uVar10) {
        local_58 = 0;
        local_98 = image;
        do {
          if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            local_40 = BlueNoiseTextures + (uVar7 & 0x7f) * 2;
            local_48 = local_58 << 0x20;
            uVar10 = 0;
            uVar6 = 0;
            do {
              puVar11 = (ushort *)(local_40 + ((uVar10 & 0x7f) << 8));
              p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_48 | uVar6);
              lVar8 = 0;
              local_50 = uVar6;
              do {
                local_8c = (float)*puVar11 / 65535.0 + -0.5;
                auVar17._0_4_ = GetChannel(this,p,(int)lVar8,(WrapMode2D)0x200000002);
                auVar17._4_60_ = extraout_var;
                auVar23 = ZEXT816(0) << 0x40;
                if ((auVar17._0_4_ < 0.0) || (1.0 < auVar17._0_4_)) {
                  local_9c = local_9c + 1;
                }
                if (auVar17._0_4_ <= 0.0) {
                  uVar5 = '\0';
                }
                else {
                  uVar5 = 0xff;
                  if (auVar17._0_4_ < 1.0) {
                    fVar13 = 12.92;
                    if (0.0031308 < auVar17._0_4_) {
                      auVar15 = vmaxss_avx(auVar17._0_16_,auVar23);
                      if (auVar15._0_4_ < 0.0) {
                        local_88 = CONCAT44(local_88._4_4_,auVar17._0_4_);
                        auVar18._0_4_ = sqrtf(auVar15._0_4_);
                        auVar18._4_60_ = extraout_var_00;
                        auVar15 = auVar18._0_16_;
                        auVar23 = ZEXT816(0) << 0x40;
                        auVar17._0_4_ = (Float)local_88;
                      }
                      else {
                        auVar15 = vsqrtss_avx(auVar15,auVar15);
                      }
                      auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbc84ba3b),0),auVar15,
                                                ZEXT416(0x3f4151ce));
                      auVar14._0_4_ = auVar15._0_4_;
                      auVar15 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar14._0_4_ + 1.8970238)),
                                              0x10);
                      auVar14._4_4_ = auVar14._0_4_;
                      auVar14._8_4_ = auVar14._0_4_;
                      auVar14._12_4_ = auVar14._0_4_;
                      auVar15 = vfmadd213ps_fma(auVar15,auVar14,_DAT_0045a640);
                      auVar15 = vfmadd213ps_fma(auVar15,auVar14,_DAT_0045a650);
                      auVar15 = vfmadd213ps_fma(auVar15,auVar14,_DAT_0045a660);
                      auVar12 = vfmadd213ps_fma(auVar15,auVar14,_DAT_0045a670);
                      auVar15 = vmovshdup_avx(auVar12);
                      fVar13 = auVar12._0_4_ / auVar15._0_4_;
                    }
                    auVar15 = vfmadd213ss_fma(ZEXT416((uint)(auVar17._0_4_ * fVar13)),
                                              SUB6416(ZEXT464(0x437f0000),0),ZEXT416((uint)local_8c)
                                             );
                    auVar21._8_4_ = 0x3effffff;
                    auVar21._0_8_ = 0x3effffff3effffff;
                    auVar21._12_4_ = 0x3effffff;
                    auVar4._8_4_ = 0x80000000;
                    auVar4._0_8_ = 0x8000000080000000;
                    auVar4._12_4_ = 0x80000000;
                    auVar12 = vpternlogd_avx512vl(auVar21,auVar15,auVar4,0xf8);
                    auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar12._0_4_));
                    auVar12 = vroundss_avx(auVar15,auVar15,0xb);
                    auVar15 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar12);
                    uVar3 = vcmpss_avx512f(auVar12,auVar23,1);
                    uVar5 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar15._0_4_);
                  }
                }
                local_98[lVar8 + (long)(int)((this->resolution).super_Tuple2<pbrt::Point2,_int>.x *
                                             uVar7 + uVar10) * 3] = uVar5;
                lVar8 = lVar8 + 1;
                puVar11 = puVar11 + 0x4000;
              } while (lVar8 != 3);
              uVar6 = local_50 + 1;
              uVar10 = uVar10 + 1;
            } while ((long)uVar6 < (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
          }
          local_58 = local_58 + 1;
          uVar10 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          uVar7 = uVar7 + 1;
          image = local_98;
        } while (local_58 < (int)uVar10);
      }
      name = local_60;
      uVar10 = lodepng_encode24_file
                         ((local_60->_M_dataplus)._M_p,image,
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,uVar10);
    }
    operator_delete__(image);
  }
LAB_00273255:
  paVar1 = &local_80.field_2;
  if (0 < local_9c) {
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,int&>
              (&local_80,"%s: %d out of gamut pixel channels clamped to [0,1].",name,&local_9c);
    Warning((FileLoc *)0x0,local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  if (uVar10 != 0) {
    local_38 = lodepng_error_text(uVar10);
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,char_const*>
              (&local_80,"Error writing PNG \"%s\": %s",name,&local_38);
    Error((FileLoc *)0x0,local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  return uVar10 == 0;
}

Assistant:

bool Image::WritePNG(const std::string &name, const ImageMetadata &metadata) const {
    unsigned int error = 0;
    int nOutOfGamut = 0;

    if (format == PixelFormat::U256) {
        if (NChannels() == 1)
            error = lodepng_encode_file(name.c_str(), p8.data(), resolution.x,
                                        resolution.y, LCT_GREY, 8 /* bitdepth */);
        else if (NChannels() == 3)
            // TODO: it would be nice to store the color encoding used in the
            // PNG metadata...
            error = lodepng_encode24_file(name.c_str(), p8.data(), resolution.x,
                                          resolution.y);
        else
            LOG_FATAL("Unhandled channel count in WritePNG(): %d", NChannels());
    } else if (NChannels() == 3) {
        // It may not actually be RGB, but that's what PNG's going to
        // assume..
        std::unique_ptr<uint8_t[]> rgb8 =
            std::make_unique<uint8_t[]>(3 * resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x)
                for (int c = 0; c < 3; ++c) {
                    Float dither = -.5f + BlueNoise(c, {x, y});
                    Float v = GetChannel({x, y}, c);
                    if (v < 0 || v > 1)
                        ++nOutOfGamut;
                    rgb8[3 * (y * resolution.x + x) + c] = LinearToSRGB8(v, dither);
                }

        error =
            lodepng_encode24_file(name.c_str(), rgb8.get(), resolution.x, resolution.y);
    } else if (NChannels() == 1) {
        std::unique_ptr<uint8_t[]> y8 =
            std::make_unique<uint8_t[]>(resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x) {
                Float dither = -.5f + BlueNoise(0, {x, y});
                Float v = GetChannel({x, y}, 0);
                if (v < 0 || v > 1)
                    ++nOutOfGamut;
                y8[y * resolution.x + x] = LinearToSRGB8(v, dither);
            }

        error = lodepng_encode_file(name.c_str(), y8.get(), resolution.x, resolution.y,
                                    LCT_GREY, 8 /* bitdepth */);
    }

    if (nOutOfGamut > 0)
        Warning("%s: %d out of gamut pixel channels clamped to [0,1].", name,
                nOutOfGamut);

    if (error != 0) {
        Error("Error writing PNG \"%s\": %s", name, lodepng_error_text(error));
        return false;
    }
    return true;
}